

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O0

void anon_unknown.dwarf_1110a7::fill5(unsigned_short *data,int n)

{
  int i_1;
  int k;
  int j;
  int i;
  int n_local;
  unsigned_short *data_local;
  
  for (i = 0; i < n; i = i + 1) {
    data[i] = 0;
  }
  j = 0;
  k = 0;
  i_1 = 0;
  while( true ) {
    if (n <= i_1) {
      return;
    }
    data[i_1] = (unsigned_short)j;
    j = j + k;
    k = k + 1;
    if (0xffff < j) break;
    i_1 = i_1 + 1;
  }
  return;
}

Assistant:

void
fill5 (unsigned short data[/*n*/], int n)
{
    for (int i = 0; i < n; ++i)
        data[i] = 0;

    int j = 0, k = 0;

    for (int i = 0; i < n; ++i)
    {
        data[i] = j;
        j       = j + k;
        k       = k + 1;

        if (j > USHRT_MAX) break;
    }
}